

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_SetRenderStyle
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  uint uVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  undefined8 uVar5;
  PClass *pPVar6;
  ulong uVar7;
  char *pcVar8;
  bool bVar9;
  double dVar10;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      puVar3 = (undefined8 *)(param->field_0).field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar5 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar5;
        }
        pPVar6 = (PClass *)puVar3[1];
        bVar9 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar4 && bVar9) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar9 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar4) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar9) {
          pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d2f64;
        }
      }
      if (numparam == 1) {
        pcVar8 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x01') {
          dVar1 = param[1].field_0.f;
          if (numparam < 3) {
            param = defaultparam->Array;
            if (param[2].field_0.field_3.Type == '\0') goto LAB_003d2edb;
            pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[2].field_0.field_3.Type == '\0') {
LAB_003d2edb:
              uVar2 = param[2].field_0.i;
              dVar10 = 1.0;
              if (dVar1 <= 1.0) {
                dVar10 = dVar1;
              }
              puVar3[0x23] = -(ulong)(0.0 < dVar1) & (ulong)dVar10;
              uVar7 = (ulong)uVar2;
              if (0xd < uVar2) {
                uVar7 = 0;
              }
              *(FRenderStyle *)(puVar3 + 0x21) = LegacyRenderStyles[uVar7];
              return 0;
            }
            pcVar8 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0xcc6,
                        "int AF_AActor_A_SetRenderStyle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar8 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xcc5,
                    "int AF_AActor_A_SetRenderStyle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003d2f64:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xcc4,
                "int AF_AActor_A_SetRenderStyle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetRenderStyle)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(alpha);
	PARAM_INT_DEF(mode);

	self->Alpha = clamp(alpha, 0., 1.);
	self->RenderStyle = ERenderStyle(mode);
	return 0;
}